

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O1

ctmbstr prvTidytidyLocalizedStringN(uint messageType,uint quantity)

{
  languageDefinition *plVar1;
  languageDefinition *plVar2;
  uint uVar3;
  ctmbstr ptVar4;
  uint *puVar5;
  
  plVar1 = tidyLanguages.currentLanguage;
  uVar3 = (*(tidyLanguages.currentLanguage)->whichPluralForm)(quantity);
  plVar2 = tidyLanguages.fallbackLanguage;
  ptVar4 = plVar1->messages[0].value;
  if (ptVar4 != (ctmbstr)0x0) {
    puVar5 = &plVar1->messages[0].pluralForm;
    do {
      if ((((languageDictionaryEntry *)(puVar5 + -1))->key == messageType) && (*puVar5 == uVar3))
      goto LAB_0013788d;
      ptVar4 = *(ctmbstr *)(puVar5 + 5);
      puVar5 = puVar5 + 4;
    } while (ptVar4 != (ctmbstr)0x0);
  }
  ptVar4 = (ctmbstr)0x0;
LAB_0013788d:
  if (tidyLanguages.fallbackLanguage != (languageDefinition *)0x0 && ptVar4 == (ctmbstr)0x0) {
    uVar3 = (*(tidyLanguages.fallbackLanguage)->whichPluralForm)(quantity);
    ptVar4 = plVar2->messages[0].value;
    if (ptVar4 != (ctmbstr)0x0) {
      puVar5 = &plVar2->messages[0].pluralForm;
      do {
        if ((((languageDictionaryEntry *)(puVar5 + -1))->key == messageType) && (*puVar5 == uVar3))
        goto LAB_001378d5;
        ptVar4 = *(ctmbstr *)(puVar5 + 5);
        puVar5 = puVar5 + 4;
      } while (ptVar4 != (ctmbstr)0x0);
    }
    ptVar4 = (ctmbstr)0x0;
  }
LAB_001378d5:
  if (ptVar4 == (ctmbstr)0x0) {
    uVar3 = (*language_en.whichPluralForm)(quantity);
    if (language_en.messages[0].value != (ctmbstr)0x0) {
      puVar5 = &language_en.messages[0].pluralForm;
      ptVar4 = language_en.messages[0].value;
      do {
        if ((((languageDictionaryEntry *)(puVar5 + -1))->key == messageType) && (*puVar5 == uVar3))
        goto LAB_0013790f;
        ptVar4 = *(ctmbstr *)(puVar5 + 5);
        puVar5 = puVar5 + 4;
      } while (ptVar4 != (ctmbstr)0x0);
    }
    ptVar4 = (ctmbstr)0x0;
  }
LAB_0013790f:
  if (ptVar4 == (ctmbstr)0x0) {
    uVar3 = (*language_en.whichPluralForm)(1);
    if (language_en.messages[0].value != (ctmbstr)0x0) {
      puVar5 = &language_en.messages[0].pluralForm;
      ptVar4 = language_en.messages[0].value;
      do {
        if ((((languageDictionaryEntry *)(puVar5 + -1))->key == messageType) && (*puVar5 == uVar3))
        {
          return ptVar4;
        }
        ptVar4 = *(ctmbstr *)(puVar5 + 5);
        puVar5 = puVar5 + 4;
      } while (ptVar4 != (ctmbstr)0x0);
    }
    ptVar4 = (ctmbstr)0x0;
  }
  return ptVar4;
}

Assistant:

ctmbstr TY_(tidyLocalizedStringN)( uint messageType, uint quantity )
{
    ctmbstr result;
    
    result  = tidyLocalizedStringImpl( messageType, tidyLanguages.currentLanguage, quantity);
    
    if (!result && tidyLanguages.fallbackLanguage )
    {
        result = tidyLocalizedStringImpl( messageType, tidyLanguages.fallbackLanguage, quantity);
    }
    
    if (!result)
    {
        /* Fallback to en which is built in. */
        result = tidyLocalizedStringImpl( messageType, &language_en, quantity);
    }
    
    if (!result)
    {
        /* Last resort: Fallback to en singular which is built in. */
        result = tidyLocalizedStringImpl( messageType, &language_en, 1);
    }
    
    return result;
}